

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O2

bool medit_race(CHAR_DATA *ch,char *argument)

{
  void *pvVar1;
  int iVar2;
  RACE_DATA *pRVar3;
  long lVar4;
  uint uVar5;
  char *txt;
  long lVar6;
  char buf [4608];
  
  if (*argument != '\0') {
    iVar2 = race_lookup(argument);
    if (iVar2 != -1) {
      pvVar1 = ch->desc->pEdit;
      *(short *)((long)pvVar1 + 0x11c) = (short)iVar2;
      pRVar3 = race_data_lookup(iVar2);
      BITWISE_OR((long *)((long)pvVar1 + 0xc0),pRVar3->off);
      pRVar3 = race_data_lookup(iVar2);
      BITWISE_OR((long *)((long)pvVar1 + 0xd0),pRVar3->imm);
      pRVar3 = race_data_lookup(iVar2);
      BITWISE_OR((long *)((long)pvVar1 + 0xe0),pRVar3->res);
      pRVar3 = race_data_lookup(iVar2);
      BITWISE_OR((long *)((long)pvVar1 + 0xf0),pRVar3->vuln);
      pRVar3 = race_data_lookup(iVar2);
      BITWISE_OR((long *)((long)pvVar1 + 0x128),pRVar3->form);
      pRVar3 = race_data_lookup(iVar2);
      BITWISE_OR((long *)((long)pvVar1 + 0x138),pRVar3->parts);
      send_to_char("Race set.\n\r",ch);
      return true;
    }
    if (*argument == '?') {
      send_to_char("Available races are:",ch);
      uVar5 = 0;
      iVar2 = 0;
      lVar6 = 0;
      while( true ) {
        lVar4 = *(long *)((long)(race_table.
                                 super__Vector_base<race_type,_std::allocator<race_type>_>._M_impl.
                                 super__Vector_impl_data._M_start)->act + lVar6 + -0x10);
        if (lVar4 == 0) break;
        if ((uVar5 / 3) * 3 + iVar2 == 0) {
          send_to_char("\n\r",ch);
          lVar4 = *(long *)((long)(race_table.
                                   super__Vector_base<race_type,_std::allocator<race_type>_>._M_impl
                                   .super__Vector_impl_data._M_start)->act + lVar6 + -0x10);
        }
        sprintf(buf," %-15s",lVar4);
        send_to_char(buf,ch);
        lVar6 = lVar6 + 0x2e8;
        iVar2 = iVar2 + -1;
        uVar5 = uVar5 + 1;
      }
      txt = "\n\r";
      goto LAB_003a5461;
    }
  }
  txt = "Syntax:  race [race]\n\rType \'race ?\' for a list of races.\n\r";
LAB_003a5461:
  send_to_char(txt,ch);
  return false;
}

Assistant:

bool medit_race(CHAR_DATA *ch, char *argument)
{
	MOB_INDEX_DATA *pMob;
	int race;

	if (argument[0] != '\0' && (race = race_lookup(argument)) != -1)
	{
		EDIT_MOB(ch, pMob);

		pMob->race = race;
		BITWISE_OR(pMob->off_flags, race_data_lookup(race)->off);
		BITWISE_OR(pMob->imm_flags, race_data_lookup(race)->imm);
		BITWISE_OR(pMob->res_flags, race_data_lookup(race)->res);
		BITWISE_OR(pMob->vuln_flags, race_data_lookup(race)->vuln);
		BITWISE_OR(pMob->form, race_data_lookup(race)->form);
		BITWISE_OR(pMob->parts, race_data_lookup(race)->parts);

		send_to_char("Race set.\n\r", ch);
		return true;
	}

	if (argument[0] == '?')
	{
		char buf[MAX_STRING_LENGTH];

		send_to_char("Available races are:", ch);

		for (race = 0; race_table[race].name != nullptr; race++)
		{
			if (race % 3 == 0)
				send_to_char("\n\r", ch);

			sprintf(buf, " %-15s", race_table[race].name);
			send_to_char(buf, ch);
		}

		send_to_char("\n\r", ch);
		return false;
	}

	send_to_char("Syntax:  race [race]\n\r"\
				 "Type 'race ?' for a list of races.\n\r", ch);
	return false;
}